

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

void __thiscall
capnp::SchemaParser::ModuleImpl::addError
          (ModuleImpl *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  uint *puVar6;
  size_t sVar7;
  SchemaFile *pSVar8;
  uint endCol;
  uint endLine;
  uint startCol;
  uint startLine;
  Vector<unsigned_int> *lines;
  uint32_t endByte_local;
  uint32_t startByte_local;
  ModuleImpl *this_local;
  StringPtr message_local;
  
  message_local.content.ptr = (char *)message.content.size_;
  this_local = (ModuleImpl *)message.content.ptr;
  lines._0_4_ = endByte;
  lines._4_4_ = startByte;
  _endByte_local = this;
  _startLine = kj::Lazy<kj::Vector<unsigned_int>>::
               get<capnp::SchemaParser::ModuleImpl::addError(unsigned_int,unsigned_int,kj::StringPtr)::_lambda(kj::SpaceFor<kj::Vector<unsigned_int>>&)_1_>
                         ((Lazy<kj::Vector<unsigned_int>> *)&this->lineBreaks,(long)&startCol + 3);
  sVar5 = anon_unknown_31::findLargestElementBefore<unsigned_int>
                    (_startLine,(uint *)((long)&lines + 4));
  uVar4 = lines._4_4_;
  puVar6 = kj::Vector<unsigned_int>::operator[](_startLine,sVar5 & 0xffffffff);
  uVar1 = *puVar6;
  sVar7 = anon_unknown_31::findLargestElementBefore<unsigned_int>(_startLine,(uint *)&lines);
  uVar3 = (uint32_t)lines;
  puVar6 = kj::Vector<unsigned_int>::operator[](_startLine,sVar7 & 0xffffffff);
  uVar2 = *puVar6;
  pSVar8 = kj::Own<const_capnp::SchemaFile,_std::nullptr_t>::operator->(&this->file);
  (*pSVar8->_vptr_SchemaFile[5])
            (pSVar8,CONCAT44((int)sVar5,lines._4_4_),(ulong)(uVar4 - uVar1),
             CONCAT44((int)sVar7,(uint32_t)lines),(ulong)(uVar3 - uVar2),message_local.content.ptr,
             this_local,message_local.content.ptr);
  this->parser->hadErrors = true;
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    auto& lines = lineBreaks.get(
        [](kj::SpaceFor<kj::Vector<uint>>& space) {
          KJ_FAIL_REQUIRE("Can't report errors until loadContent() is called.");
          return space.construct();
        });

    // TODO(someday):  This counts tabs as single characters.  Do we care?
    uint startLine = findLargestElementBefore(lines, startByte);
    uint startCol = startByte - lines[startLine];
    uint endLine = findLargestElementBefore(lines, endByte);
    uint endCol = endByte - lines[endLine];

    file->reportError(
        SchemaFile::SourcePos { startByte, startLine, startCol },
        SchemaFile::SourcePos { endByte, endLine, endCol },
        message);

    // We intentionally only set hadErrors true if reportError() didn't throw.
    parser.hadErrors = true;
  }